

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node_iterator * __thiscall pugi::xml_node_iterator::operator--(xml_node_iterator *this)

{
  xml_node xVar1;
  
  if ((this->_wrap)._root == (xml_node_struct *)0x0) {
    xVar1 = xml_node::last_child(&this->_parent);
  }
  else {
    xVar1 = xml_node::previous_sibling(&this->_wrap);
  }
  (this->_wrap)._root = xVar1._root;
  return this;
}

Assistant:

PUGI_IMPL_FN xml_node_iterator& xml_node_iterator::operator--()
	{
		_wrap = _wrap._root ? _wrap.previous_sibling() : _parent.last_child();
		return *this;
	}